

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t mime_mem_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  ulong __n;
  
  __n = *(long *)((long)instream + 0x78) - *(long *)((long)instream + 0x98);
  if (nitems <= __n) {
    __n = nitems;
  }
  if (__n != 0) {
    memcpy(buffer,(void *)(*(long *)((long)instream + 0x98) + *(long *)((long)instream + 0x20)),__n)
    ;
  }
  *(long *)((long)instream + 0x98) = *(long *)((long)instream + 0x98) + __n;
  return __n;
}

Assistant:

static size_t mime_mem_read(char *buffer, size_t size, size_t nitems,
                            void *instream)
{
  curl_mimepart *part = (curl_mimepart *) instream;
  size_t sz = (size_t) part->datasize - part->state.offset;
  (void) size;   /* Always 1.*/

  if(sz > nitems)
    sz = nitems;

  if(sz)
    memcpy(buffer, (char *) &part->data[part->state.offset], sz);

  part->state.offset += sz;
  return sz;
}